

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_continue(SASL *sasl,Curl_easy *data,int code,saslprogress *progress)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  char *local_a8;
  undefined1 local_a0 [8];
  bufref serverdata;
  char *oauth_bearer;
  char *service;
  int port;
  char *disp_hostname;
  char *hostname;
  bufref resp;
  saslstate newstate;
  connectdata *conn;
  CURLcode result;
  saslprogress *progress_local;
  int code_local;
  Curl_easy *data_local;
  SASL *sasl_local;
  
  conn._4_4_ = CURLE_OK;
  pcVar1 = data->conn;
  resp.len._4_4_ = SASL_FINAL;
  if ((data->set).str[0xc] == (char *)0x0) {
    local_a8 = sasl->params->service;
  }
  else {
    local_a8 = (data->set).str[0xc];
  }
  serverdata.len = (size_t)(data->set).str[0x3c];
  Curl_conn_get_host(data,0,&disp_hostname,(char **)&stack0xffffffffffffff90,
                     (int *)((long)&service + 4));
  Curl_bufref_init((bufref *)local_a0);
  Curl_bufref_init((bufref *)&hostname);
  *progress = SASL_INPROGRESS;
  if (sasl->state == SASL_FINAL) {
    if (code != sasl->params->finalcode) {
      conn._4_4_ = CURLE_LOGIN_DENIED;
    }
    *progress = SASL_DONE;
    sasl_state(sasl,data,SASL_STOP);
    return conn._4_4_;
  }
  if (((sasl->state != SASL_CANCEL) && (sasl->state != SASL_OAUTH2_RESP)) &&
     (code != sasl->params->contcode)) {
    *progress = SASL_DONE;
    sasl_state(sasl,data,SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }
  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return CURLE_OK;
  case SASL_PLAIN:
    conn._4_4_ = Curl_auth_create_plain_message
                           (pcVar1->sasl_authzid,pcVar1->user,pcVar1->passwd,(bufref *)&hostname);
    break;
  case SASL_LOGIN:
    Curl_auth_create_login_message(pcVar1->user,(bufref *)&hostname);
    resp.len._4_4_ = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    Curl_auth_create_login_message(pcVar1->passwd,(bufref *)&hostname);
    break;
  case SASL_EXTERNAL:
    Curl_auth_create_external_message(pcVar1->user,(bufref *)&hostname);
    break;
  case SASL_CRAMMD5:
    conn._4_4_ = get_server_message(sasl,data,(bufref *)local_a0);
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_auth_create_cram_md5_message
                             ((bufref *)local_a0,pcVar1->user,pcVar1->passwd,(bufref *)&hostname);
    }
    break;
  case SASL_DIGESTMD5:
    conn._4_4_ = get_server_message(sasl,data,(bufref *)local_a0);
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_auth_create_digest_md5_message
                             (data,(bufref *)local_a0,pcVar1->user,pcVar1->passwd,local_a8,
                              (bufref *)&hostname);
    }
    if ((conn._4_4_ == CURLE_OK) && ((sasl->params->flags & 1) != 0)) {
      resp.len._4_4_ = SASL_DIGESTMD5_RESP;
    }
    break;
  case SASL_DIGESTMD5_RESP:
    break;
  case SASL_NTLM:
    conn._4_4_ = Curl_auth_create_ntlm_type1_message
                           (data,pcVar1->user,pcVar1->passwd,local_a8,disp_hostname,&pcVar1->ntlm,
                            (bufref *)&hostname);
    resp.len._4_4_ = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    conn._4_4_ = get_server_message(sasl,data,(bufref *)local_a0);
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_auth_decode_ntlm_type2_message(data,(bufref *)local_a0,&pcVar1->ntlm);
    }
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_auth_create_ntlm_type3_message
                             (data,pcVar1->user,pcVar1->passwd,&pcVar1->ntlm,(bufref *)&hostname);
    }
    break;
  default:
    Curl_failf(data,"Unsupported SASL authentication mechanism");
    conn._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case SASL_OAUTH2:
    if (sasl->authused == 0x100) {
      conn._4_4_ = Curl_auth_create_oauth_bearer_message
                             (pcVar1->user,disp_hostname,(long)service._4_4_,(char *)serverdata.len,
                              (bufref *)&hostname);
      resp.len._4_4_ = SASL_OAUTH2_RESP;
    }
    else {
      conn._4_4_ = Curl_auth_create_xoauth_bearer_message
                             (pcVar1->user,(char *)serverdata.len,(bufref *)&hostname);
    }
    break;
  case SASL_OAUTH2_RESP:
    if (code == sasl->params->finalcode) {
      *progress = SASL_DONE;
      sasl_state(sasl,data,SASL_STOP);
      return CURLE_OK;
    }
    if (code != sasl->params->contcode) {
      *progress = SASL_DONE;
      sasl_state(sasl,data,SASL_STOP);
      return CURLE_LOGIN_DENIED;
    }
    Curl_bufref_set((bufref *)&hostname,"\x01",1,(_func_void_void_ptr *)0x0);
    break;
  case SASL_CANCEL:
    sasl->authmechs = sasl->authmechs ^ sasl->authused;
    CVar2 = Curl_sasl_start(sasl,data,((byte)sasl->field_0x1e >> 2 & 1) != 0,progress);
    return CVar2;
  }
  Curl_bufref_free((bufref *)local_a0);
  if (conn._4_4_ == CURLE_OK) {
    conn._4_4_ = build_message(sasl,(bufref *)&hostname);
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = (*sasl->params->contauth)(data,sasl->curmech,(bufref *)&hostname);
    }
  }
  else if (conn._4_4_ == CURLE_BAD_CONTENT_ENCODING) {
    conn._4_4_ = (*sasl->params->cancelauth)(data,sasl->curmech);
    resp.len._4_4_ = SASL_CANCEL;
  }
  else {
    resp.len._4_4_ = SASL_STOP;
    *progress = SASL_DONE;
  }
  Curl_bufref_free((bufref *)&hostname);
  sasl_state(sasl,data,resp.len._4_4_);
  return conn._4_4_;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct Curl_easy *data,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  saslstate newstate = SASL_FINAL;
  struct bufref resp;
  const char *hostname, *disp_hostname;
  int port;
#if defined(USE_KERBEROS5) || defined(USE_NTLM) \
    || !defined(CURL_DISABLE_DIGEST_AUTH)
  const char *service = data->set.str[STRING_SERVICE_NAME] ?
    data->set.str[STRING_SERVICE_NAME] :
    sasl->params->service;
#endif
  const char *oauth_bearer = data->set.str[STRING_BEARER];
  struct bufref serverdata;

  Curl_conn_get_host(data, FIRSTSOCKET, &hostname, &disp_hostname, &port);
  Curl_bufref_init(&serverdata);
  Curl_bufref_init(&resp);
  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    sasl_state(sasl, data, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && sasl->state != SASL_OAUTH2_RESP &&
     code != sasl->params->contcode) {
    *progress = SASL_DONE;
    sasl_state(sasl, data, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = Curl_auth_create_plain_message(conn->sasl_authzid,
                                            conn->user, conn->passwd, &resp);
    break;
  case SASL_LOGIN:
    Curl_auth_create_login_message(conn->user, &resp);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    Curl_auth_create_login_message(conn->passwd, &resp);
    break;
  case SASL_EXTERNAL:
    Curl_auth_create_external_message(conn->user, &resp);
    break;
#ifdef USE_GSASL
  case SASL_GSASL:
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_gsasl_token(data, &serverdata, &conn->gsasl, &resp);
    if(!result && Curl_bufref_len(&resp) > 0)
      newstate = SASL_GSASL;
    break;
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  case SASL_CRAMMD5:
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_create_cram_md5_message(&serverdata, conn->user,
                                                 conn->passwd, &resp);
    break;
  case SASL_DIGESTMD5:
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_create_digest_md5_message(data, &serverdata,
                                                   conn->user, conn->passwd,
                                                   service, &resp);
    if(!result && (sasl->params->flags & SASL_FLAG_BASE64))
      newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    /* Keep response NULL to output an empty line. */
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data,
                                                 conn->user, conn->passwd,
                                                 service, hostname,
                                                 &conn->ntlm, &resp);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_decode_ntlm_type2_message(data, &serverdata,
                                                   &conn->ntlm);
    if(!result)
      result = Curl_auth_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  service,
                                                  conn->host.name,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    result = get_server_message(sasl, data, &serverdata);
    if(!result) {
      if(sasl->mutual_auth) {
        /* Decode the user token challenge and create the optional response
           message */
        result = Curl_auth_create_gssapi_user_message(data, NULL, NULL,
                                                      NULL, NULL,
                                                      sasl->mutual_auth,
                                                      &serverdata,
                                                      &conn->krb5,
                                                      &resp);
        newstate = SASL_GSSAPI_NO_DATA;
      }
      else
        /* Decode the security challenge and create the response message */
        result = Curl_auth_create_gssapi_security_message(data,
                                                          conn->sasl_authzid,
                                                          &serverdata,
                                                          &conn->krb5,
                                                          &resp);
    }
    break;
  case SASL_GSSAPI_NO_DATA:
    /* Decode the security challenge and create the response message */
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_create_gssapi_security_message(data,
                                                        conn->sasl_authzid,
                                                        &serverdata,
                                                        &conn->krb5,
                                                        &resp);
    break;
#endif

  case SASL_OAUTH2:
    /* Create the authorization message */
    if(sasl->authused == SASL_MECH_OAUTHBEARER) {
      result = Curl_auth_create_oauth_bearer_message(conn->user,
                                                     hostname,
                                                     port,
                                                     oauth_bearer,
                                                     &resp);

      /* Failures maybe sent by the server as continuations for OAUTHBEARER */
      newstate = SASL_OAUTH2_RESP;
    }
    else
      result = Curl_auth_create_xoauth_bearer_message(conn->user,
                                                      oauth_bearer,
                                                      &resp);
    break;

  case SASL_OAUTH2_RESP:
    /* The continuation is optional so check the response code */
    if(code == sasl->params->finalcode) {
      /* Final response was received so we are done */
      *progress = SASL_DONE;
      sasl_state(sasl, data, SASL_STOP);
      return result;
    }
    else if(code == sasl->params->contcode) {
      /* Acknowledge the continuation by sending a 0x01 response. */
      Curl_bufref_set(&resp, "\x01", 1, NULL);
      break;
    }
    else {
      *progress = SASL_DONE;
      sasl_state(sasl, data, SASL_STOP);
      return CURLE_LOGIN_DENIED;
    }

  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    return Curl_sasl_start(sasl, data, sasl->force_ir, progress);
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  Curl_bufref_free(&serverdata);

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->cancelauth(data, sasl->curmech);
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    result = build_message(sasl, &resp);
    if(!result)
      result = sasl->params->contauth(data, sasl->curmech, &resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  Curl_bufref_free(&resp);

  sasl_state(sasl, data, newstate);

  return result;
}